

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

bool __thiscall QPixmapStyle::eventFilter(QPixmapStyle *this,QObject *watched,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  QSlider *pQVar6;
  QComboBox *pQVar7;
  QAbstractItemView *pQVar8;
  char *pcVar9;
  QWidget *this_00;
  QWidget *this_01;
  QEvent *in_RDX;
  QEvent *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool up;
  QPixmapStyleDescriptor *desc;
  int yCombo;
  int yPopup;
  QWidget *widget;
  QComboBox *comboBox;
  QSlider *slider;
  QPixmapStylePrivate *d;
  QRect geom;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  QPoint *in_stack_fffffffffffffe80;
  QPoint *in_stack_fffffffffffffe88;
  int pos;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  QRect *in_stack_fffffffffffffeb0;
  Type in_stack_fffffffffffffeb8;
  Type in_stack_fffffffffffffebc;
  bool local_e5;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPixmapStyle *)0x402886);
  pQVar6 = qobject_cast<QSlider*>((QObject *)0x40289b);
  if ((pQVar6 != (QSlider *)0x0) &&
     ((in_stack_fffffffffffffebc = QEvent::type(in_RDX),
      in_stack_fffffffffffffebc - MouseButtonPress < 2 || (in_stack_fffffffffffffebc == MouseMove)))
     ) {
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  pQVar7 = qobject_cast<QComboBox*>((QObject *)0x4028ef);
  if (pQVar7 != (QComboBox *)0x0) {
    in_stack_fffffffffffffeb8 = QEvent::type(in_RDX);
    if (in_stack_fffffffffffffeb8 == MouseButtonPress) {
      QEvent::ignore(in_RDX);
      ::QVariant::QVariant(&local_28,true);
      QObject::setProperty
                ((QObject *)in_stack_fffffffffffffe80,
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (QVariant *)0x40296a);
      ::QVariant::~QVariant(&local_28);
      QWidget::repaint((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_e5 = true;
      goto LAB_00402cb2;
    }
    if (in_stack_fffffffffffffeb8 == MouseButtonRelease) {
      ::QVariant::QVariant(&local_48,false);
      QObject::setProperty
                ((QObject *)in_stack_fffffffffffffe80,
                 (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (QVariant *)0x4029c0);
      ::QVariant::~QVariant(&local_48);
      QWidget::repaint((QWidget *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pQVar8 = QComboBox::view((QComboBox *)in_stack_fffffffffffffe80);
      if (pQVar8 != (QAbstractItemView *)0x0) {
        QComboBox::view((QComboBox *)in_stack_fffffffffffffe80);
        bVar1 = QWidget::isVisible((QWidget *)0x4029f9);
        if ((bVar1) || (bVar1 = QWidget::isEnabled((QWidget *)0x402a07), !bVar1)) {
          (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1b0))();
        }
        else {
          (**(code **)(*(long *)&pQVar7->super_QWidget + 0x1a8))();
        }
      }
    }
  }
  (*(code *)**(undefined8 **)in_RSI)();
  pcVar9 = (char *)QMetaObject::className();
  iVar3 = qstrcmp(pcVar9,"QComboBoxPrivateContainer");
  if ((iVar3 == 0) && (TVar4 = QEvent::type(in_RDX), TVar4 == Show)) {
    this_00 = qobject_cast<QWidget*>
                        ((QObject *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QWidget::geometry(this_00);
    iVar3 = QRect::top((QRect *)0x402a98);
    this_01 = QWidget::parentWidget((QWidget *)0x402aa6);
    QPoint::QPoint(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    QWidget::mapToGlobal
              ((QWidget *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    pos = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    iVar5 = QPoint::y((QPoint *)0x402ae3);
    QWidget::geometry(this_00);
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
              ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)this_01,
               (ControlDescriptor *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    bVar1 = iVar3 < iVar5;
    QRect::top((QRect *)0x402b8f);
    if (bVar1) {
      iVar3 = QMargins::top((QMargins *)0x402ba8);
    }
    else {
      iVar3 = QMargins::bottom((QMargins *)0x402bbc);
      iVar3 = -iVar3;
    }
    QRect::moveTop((QRect *)CONCAT44(iVar3,in_stack_fffffffffffffe90),pos);
    QWidget::setGeometry
              ((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffeb0);
    ::QVariant::QVariant(&local_68,bVar1);
    QObject::setProperty
              (&this_00->super_QObject,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (QVariant *)0x402c28);
    ::QVariant::~QVariant(&local_68);
    QWidget::parentWidget((QWidget *)0x402c3f);
    ::QVariant::QVariant(&local_88,bVar1);
    QObject::setProperty
              (&this_00->super_QObject,
               (char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (QVariant *)0x402c73);
    ::QVariant::~QVariant(&local_88);
    QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x402c8d);
  }
  bVar2 = QObject::eventFilter(in_RDI,in_RSI);
  local_e5 = (bool)(bVar2 & 1);
LAB_00402cb2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_e5;
}

Assistant:

bool QPixmapStyle::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QPixmapStyle);
#if QT_CONFIG(slider)
    if (QSlider *slider = qobject_cast<QSlider*>(watched)) {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseMove:
            slider->update();
            break;
        default: ;
        }
    }
#endif // QT_CONFIG(slider)
#if QT_CONFIG(combobox)
    if (QComboBox *comboBox = qobject_cast<QComboBox*>(watched)) {
        switch (event->type()) {
        case QEvent::MouseButtonPress:
            event->ignore();
            comboBox->setProperty("_pixmapstyle_combobox_pressed", true);
            comboBox->repaint();
            return true;
        case QEvent::MouseButtonRelease:
            comboBox->setProperty("_pixmapstyle_combobox_pressed", false);
            comboBox->repaint();
            if ( comboBox->view() ) {
                if ( comboBox->view()->isVisible() || (!comboBox->isEnabled()))
                    comboBox->hidePopup();
                else
                    comboBox->showPopup();
            }
            break;
        default: ;
        }
    }
#endif // QT_CONFIG(combobox)

    if (qstrcmp(watched->metaObject()->className(),"QComboBoxPrivateContainer") == 0) {
        if (event->type() == QEvent::Show) {
            QWidget *widget = qobject_cast<QWidget*>(watched);
            int yPopup = widget->geometry().top();
            int yCombo = widget->parentWidget()->mapToGlobal(QPoint(0, 0)).y();
            QRect geom = widget->geometry();
            const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);
            const bool up = yPopup < yCombo;
            geom.moveTop(geom.top() + (up ? desc.margins.top() : -desc.margins.bottom()));
            widget->setGeometry(geom);
            widget->setProperty("_pixmapstyle_combobox_up", up);
            widget->parentWidget()->setProperty("_pixmapstyle_combobox_up", up);
        }
    }

    return QCommonStyle::eventFilter(watched, event);
}